

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

void __thiscall
Clasp::UncoreMinimize::UncoreMinimize(UncoreMinimize *this,SharedMinimizeData *d,OptParams *params)

{
  uint32 uVar1;
  void *pvVar2;
  undefined4 *in_RDX;
  undefined8 *in_RDI;
  SharedData *in_stack_ffffffffffffff98;
  MinimizeConstraint *in_stack_ffffffffffffffa0;
  pod_vector<Clasp::UncoreMinimize::LitData,_std::allocator<Clasp::UncoreMinimize::LitData>_>
  *in_stack_ffffffffffffffb0;
  Todo *this_00;
  
  MinimizeConstraint::MinimizeConstraint(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *in_RDI = &PTR_propagate_002ddb70;
  in_RDI[3] = 0;
  uVar1 = SharedMinimizeData::numRules((SharedMinimizeData *)0x1b1241);
  pvVar2 = operator_new__((ulong)uVar1 << 3);
  in_RDI[4] = pvVar2;
  bk_lib::
  pod_vector<Clasp::UncoreMinimize::LitData,_std::allocator<Clasp::UncoreMinimize::LitData>_>::
  pod_vector(in_stack_ffffffffffffffb0);
  this_00 = (Todo *)(in_RDI + 7);
  bk_lib::pod_vector<Clasp::UncoreMinimize::Core,_std::allocator<Clasp::UncoreMinimize::Core>_>::
  pod_vector((pod_vector<Clasp::UncoreMinimize::Core,_std::allocator<Clasp::UncoreMinimize::Core>_>
              *)this_00);
  bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::pod_vector
            ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)this_00);
  bk_lib::
  pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>::
  pod_vector(&this_00->lits_);
  Todo::Todo(this_00);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)this_00);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)this_00);
  WCTemp::WCTemp((WCTemp *)0x1b1315);
  *(undefined4 *)(in_RDI + 0x1c) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0xe4) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)((long)in_RDI + 0x104) = *in_RDX;
  return;
}

Assistant:

UncoreMinimize::UncoreMinimize(SharedMinimizeData* d, const OptParams& params)
	: MinimizeConstraint(d)
	, enum_(0)
	, sum_(new wsum_t[d->numRules()])
	, auxInit_(UINT32_MAX)
	, auxAdd_(0)
	, freeOpen_(0)
	, options_(params) {
}